

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O3

ECPtr * loguru::get_thread_ec_head_ref(void)

{
  ECPtr *__pointer;
  
  pthread_once(&s_ec_pthread_once,ec_make_pthread_key);
  __pointer = (ECPtr *)pthread_getspecific(s_ec_pthread_key);
  if (__pointer == (ECPtr *)0x0) {
    __pointer = (ECPtr *)operator_new(8);
    *__pointer = (ECPtr)0x0;
    pthread_setspecific(s_ec_pthread_key,__pointer);
  }
  return __pointer;
}

Assistant:

ECPtr& get_thread_ec_head_ref()
	{
		(void)pthread_once(&s_ec_pthread_once, ec_make_pthread_key);
		auto ec = reinterpret_cast<ECPtr*>(pthread_getspecific(s_ec_pthread_key));
		if (ec == nullptr) {
			ec = new ECPtr(nullptr);
			(void)pthread_setspecific(s_ec_pthread_key, ec);
		}
		return *ec;
	}